

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl_tests.cpp
# Opt level: O2

void utest_register_gui_component_parse_invalid(void)

{
  size_t sVar1;
  char *pcVar2;
  utest_test_state_s *puVar3;
  
  sVar1 = utest_state.tests_length;
  utest_state.tests_length = utest_state.tests_length + 1;
  pcVar2 = (char *)malloc(0x1c);
  puVar3 = (utest_test_state_s *)realloc(utest_state.tests,sVar1 * 0x18 + 0x18);
  utest_state.tests = puVar3;
  puVar3[sVar1].func = utest_gui_component_parse_invalid;
  puVar3[sVar1].name = pcVar2;
  builtin_strncpy(pcVar2,"gui.component_parse_invalid",0x1c);
  return;
}

Assistant:

UTEST(gui, component_parse_invalid) {
    std::string line, uniform_line, error;
    GUIComponent component;

    line = "invalid_gui(-1, 2.5)";
    uniform_line = "uniform float v0;";
    T(!GUIComponentParse(0, line, uniform_line, {}, component, error));
    TSTR(error.c_str(), "Invalid GUI type name 'invalid_gui' at line 0");

    line = "invalid_gui()";
    uniform_line = "uniform float v0;";
    T(!GUIComponentParse(0, line, uniform_line, {}, component, error));
    TSTR(error.c_str(), "Invalid GUI type name 'invalid_gui' at line 0");
}